

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cp.cpp
# Opt level: O0

bool __thiscall CmdCp::CopyDirectory(CmdCp *this,string *fileFrom,string *fileTo)

{
  bool bVar1;
  FileType FVar2;
  reference pbVar3;
  string local_160 [32];
  string local_140 [36];
  undefined4 local_11c;
  string local_118 [32];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nextFileTo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nextFileFrom;
  _Self local_48;
  _Self local_40;
  iterator i;
  StrList l;
  string *fileTo_local;
  string *fileFrom_local;
  CmdCp *this_local;
  
  DirUtils::GetDirFiles((StrList *)&i,fileFrom);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
  do {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) {
      local_11c = 1;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
      return true;
    }
    std::operator+(local_88,(char)fileFrom);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_40);
    std::operator+(local_68,local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::operator+(local_d8,(char)fileTo);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_40);
    std::operator+(local_b8,local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    FVar2 = DirUtils::GetFileType(local_68);
    if (FVar2 == DU_FILE) {
      std::__cxx11::string::string(local_f8,(string *)local_68);
      std::__cxx11::string::string(local_118,(string *)local_b8);
      CopyFile(this,(string *)local_f8,(string *)local_118);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_f8);
LAB_00118f7a:
      local_11c = 0;
    }
    else {
      pbVar3 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_40);
      bVar1 = std::operator==(pbVar3,".");
      if (!bVar1) {
        pbVar3 = std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        bVar1 = std::operator==(pbVar3,"..");
        if (!bVar1) {
          DirUtils::MakeDirectory(local_b8);
          std::__cxx11::string::string(local_140,(string *)local_68);
          std::__cxx11::string::string(local_160,(string *)local_b8);
          CopyDirectory(this,(string *)local_140,(string *)local_160);
          std::__cxx11::string::~string(local_160);
          std::__cxx11::string::~string(local_140);
          goto LAB_00118f7a;
        }
      }
      local_11c = 4;
    }
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_68);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40,0);
  } while( true );
}

Assistant:

bool CmdCp::CopyDirectory(string fileFrom, string fileTo){
	auto l = GetDirFiles(fileFrom);
	for(auto i = l.begin(); i != l.end(); i++){
		auto nextFileFrom = fileFrom + '/' + *i;
		auto nextFileTo = fileTo + '/' + *i;
		if(GetFileType(nextFileFrom) == DU_FILE){
			CopyFile(nextFileFrom, nextFileTo);
		}
		else{	/* recursion */
			if(*i == "." || *i == "..")continue;
			else{
				MakeDirectory(nextFileTo);
				CopyDirectory(nextFileFrom, nextFileTo);
			}
		}
	}
	return true;
}